

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O1

void __thiscall EventLoopThreadPool::start(EventLoopThreadPool *this)

{
  pointer *pppEVar1;
  iterator __position;
  EventLoopThread *this_00;
  int iVar2;
  EventLoop *local_50;
  vector<EventLoop*,std::allocator<EventLoop*>> *local_48;
  undefined1 local_40 [8];
  shared_ptr<EventLoopThread> t;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  this->started_ = true;
  if (0 < this->numThreads_) {
    local_48 = (vector<EventLoop*,std::allocator<EventLoop*>> *)&this->loops_;
    iVar2 = 0;
    do {
      this_00 = (EventLoopThread *)operator_new(0x138);
      EventLoopThread::EventLoopThread(this_00);
      local_40 = (undefined1  [8])this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<EventLoopThread*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t,this_00);
      std::
      vector<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>::
      push_back(&this->threads_,(value_type *)local_40);
      local_50 = EventLoopThread::startLoop((EventLoopThread *)local_40);
      __position._M_current =
           (this->loops_).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->loops_).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<EventLoop*,std::allocator<EventLoop*>>::_M_realloc_insert<EventLoop*>
                  (local_48,__position,&local_50);
      }
      else {
        *__position._M_current = local_50;
        pppEVar1 = &(this->loops_).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      if (t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->numThreads_);
  }
  return;
}

Assistant:

void EventLoopThreadPool::start() {
  baseLoop_->assertInLoopThread();
  started_ = true;
  for (int i = 0; i < numThreads_; ++i) {
    std::shared_ptr<EventLoopThread> t(new EventLoopThread());
    threads_.push_back(t);
    loops_.push_back(t->startLoop());
  }
}